

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HSimplexNla.cpp
# Opt level: O0

void __thiscall
HSimplexNla::addRows
          (HSimplexNla *this,HighsLp *updated_lp,HighsInt *basic_index,
          HighsSparseMatrix *scaled_ar_matrix)

{
  HighsInt *in_RDX;
  HighsLp *in_RSI;
  HSimplexNla *in_RDI;
  HighsSparseMatrix *in_stack_00000348;
  HFactor *in_stack_00000350;
  
  setLpAndScalePointers(in_RDI,in_RSI);
  in_RDI->basic_index_ = in_RDX;
  (in_RDI->factor_).basic_index = in_RDX;
  HFactor::addRows(in_stack_00000350,in_stack_00000348);
  return;
}

Assistant:

void HSimplexNla::addRows(const HighsLp* updated_lp, HighsInt* basic_index,
                          const HighsSparseMatrix* scaled_ar_matrix) {
  // Adding rows is not so easy, since their slacks are basic
  //
  // Set the pointers for the LP, scaling and basic variables. The
  // HFactor matrix isn't needed until reinversion has to be performed
  setLpAndScalePointers(updated_lp);
  basic_index_ = basic_index;
  factor_.basic_index = basic_index;
  factor_.addRows(scaled_ar_matrix);
}